

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ImmediateBrokenPromiseNode::get(ImmediateBrokenPromiseNode *this,ExceptionOrValue *output)

{
  Exception *other;
  ExceptionOrValue *output_local;
  ImmediateBrokenPromiseNode *this_local;
  
  other = mv<kj::Exception>(&this->exception);
  Maybe<kj::Exception>::operator=(&output->exception,other);
  return;
}

Assistant:

void ImmediateBrokenPromiseNode::get(ExceptionOrValue& output) noexcept {
  output.exception = kj::mv(exception);
}